

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_access_ghost_element(Integer g_a,AccessIndex *index,Integer *subscript,Integer *ld)

{
  short sVar1;
  short sVar2;
  Integer icode;
  Integer IVar3;
  long *in_RCX;
  ulong uVar4;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d;
  Integer me;
  unsigned_long lptr;
  unsigned_long lref;
  unsigned_long elemsize;
  Integer tmp_sub [7];
  Integer i;
  Integer handle;
  char *ptr;
  int local_21c;
  int local_218;
  int local_214;
  int local_20c;
  int local_208 [7];
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8 [10];
  int local_1b0;
  int local_1ac;
  long local_1a8;
  long local_1a0;
  long local_198;
  Integer local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  Integer local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138 [8];
  long local_f8 [8];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  char *string;
  DoubleComplex *local_88;
  long alStack_78 [8];
  long local_38;
  long local_30;
  char *local_28;
  long *local_20;
  long local_18;
  long *local_10;
  
  local_28 = (char *)0x0;
  local_30 = in_RDI + 1000;
  local_38 = 0;
  local_88 = (DoubleComplex *)0x0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  icode = pnga_nodeid();
  for (local_38 = 0; local_38 < GA[local_30].ndim; local_38 = local_38 + 1) {
    alStack_78[local_38] = *(long *)(local_18 + local_38 * 8) + -1;
  }
  local_a8 = 1;
  local_b0 = (long)(GA[local_30].ndim + -1);
  local_b8 = 0;
  if (GA[local_30].distr_type == 0) {
    if (GA[local_30].num_rstrctd == 0) {
      local_160 = (long)GA[local_30].ndim;
      local_168 = 0;
      local_148 = 1;
      for (local_150 = 0; local_150 < local_160; local_150 = local_150 + 1) {
        local_148 = GA[local_30].nblock[local_150] * local_148;
      }
      if ((local_148 + -1 < icode) || (icode < 0)) {
        for (local_150 = 0; local_150 < local_160; local_150 = local_150 + 1) {
          local_f8[local_150] = 0;
          local_138[local_150] = -1;
        }
      }
      else {
        local_158 = icode;
        for (local_150 = 0; local_150 < local_160; local_150 = local_150 + 1) {
          local_140 = local_158 % (long)GA[local_30].nblock[local_150];
          local_158 = local_158 / (long)GA[local_30].nblock[local_150];
          local_170 = local_140 + local_168;
          local_168 = GA[local_30].nblock[local_150] + local_168;
          local_f8[local_150] = GA[local_30].mapc[local_170];
          if (local_140 == GA[local_30].nblock[local_150] + -1) {
            local_138[local_150] = GA[local_30].dims[local_150];
          }
          else {
            local_138[local_150] = GA[local_30].mapc[local_170 + 1] + -1;
          }
        }
      }
    }
    else if (icode < GA[local_30].num_rstrctd) {
      local_198 = (long)GA[local_30].ndim;
      local_1a0 = 0;
      local_180 = 1;
      for (local_188 = 0; local_188 < local_198; local_188 = local_188 + 1) {
        local_180 = GA[local_30].nblock[local_188] * local_180;
      }
      if ((local_180 + -1 < icode) || (icode < 0)) {
        for (local_188 = 0; local_188 < local_198; local_188 = local_188 + 1) {
          local_f8[local_188] = 0;
          local_138[local_188] = -1;
        }
      }
      else {
        local_190 = icode;
        for (local_188 = 0; local_188 < local_198; local_188 = local_188 + 1) {
          local_178 = local_190 % (long)GA[local_30].nblock[local_188];
          local_190 = local_190 / (long)GA[local_30].nblock[local_188];
          local_1a8 = local_178 + local_1a0;
          local_1a0 = GA[local_30].nblock[local_188] + local_1a0;
          local_f8[local_188] = GA[local_30].mapc[local_1a8];
          if (local_178 == GA[local_30].nblock[local_188] + -1) {
            local_138[local_188] = GA[local_30].dims[local_188];
          }
          else {
            local_138[local_188] = GA[local_30].mapc[local_1a8 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[local_30].ndim;
      local_1b0 = (int)sVar1;
      for (local_1ac = 0; local_1ac < sVar1; local_1ac = local_1ac + 1) {
        local_f8[local_1ac] = 0;
        local_138[local_1ac] = -1;
      }
    }
  }
  else {
    local_218 = (int)icode;
    if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
       (GA[local_30].distr_type == 3)) {
      sVar1 = GA[local_30].ndim;
      local_1e0 = (int)sVar1;
      sVar2 = GA[local_30].ndim;
      local_1ec = (int)sVar2;
      local_1e4 = local_218;
      local_1d8[0] = (int)((long)local_218 % GA[local_30].num_blocks[0]);
      for (local_1e8 = 1; local_1e8 < sVar2; local_1e8 = local_1e8 + 1) {
        local_1e4 = (int)((long)(local_1e4 - local_1d8[local_1e8 + -1]) /
                         GA[local_30].num_blocks[local_1e8 + -1]);
        local_1d8[local_1e8] = (int)((long)local_1e4 % GA[local_30].num_blocks[local_1e8]);
      }
      for (local_1dc = 0; local_1dc < sVar1; local_1dc = local_1dc + 1) {
        local_f8[local_1dc] = (long)local_1d8[local_1dc] * GA[local_30].block_dims[local_1dc] + 1;
        local_138[local_1dc] = (long)(local_1d8[local_1dc] + 1) * GA[local_30].block_dims[local_1dc]
        ;
        if (GA[local_30].dims[local_1dc] < local_138[local_1dc]) {
          local_138[local_1dc] = GA[local_30].dims[local_1dc];
        }
      }
    }
    else if (GA[local_30].distr_type == 4) {
      sVar1 = GA[local_30].ndim;
      local_214 = 0;
      sVar2 = GA[local_30].ndim;
      local_208[0] = (int)((long)local_218 % GA[local_30].num_blocks[0]);
      for (local_21c = 1; local_21c < sVar2; local_21c = local_21c + 1) {
        local_218 = (int)((long)(local_218 - local_208[local_21c + -1]) /
                         GA[local_30].num_blocks[local_21c + -1]);
        local_208[local_21c] = (int)((long)local_218 % GA[local_30].num_blocks[local_21c]);
      }
      for (local_20c = 0; local_20c < sVar1; local_20c = local_20c + 1) {
        local_f8[local_20c] = GA[local_30].mapc[local_214 + local_208[local_20c]];
        if ((long)local_208[local_20c] < GA[local_30].num_blocks[local_20c] + -1) {
          local_138[local_20c] = GA[local_30].mapc[local_214 + local_208[local_20c] + 1] + -1;
        }
        else {
          local_138[local_20c] = GA[local_30].dims[local_20c];
        }
        local_214 = local_214 + (int)GA[local_30].num_blocks[local_20c];
      }
    }
  }
  if (local_b0 == 0) {
    *local_20 = (local_138[0] - local_f8[0]) + 1 + GA[local_30].width[0] * 2;
  }
  for (local_a0 = 0; local_a0 < local_b0; local_a0 = local_a0 + 1) {
    local_b8 = alStack_78[local_a0] * local_a8 + local_b8;
    local_20[local_a0] =
         (local_138[local_a0] - local_f8[local_a0]) + 1 + GA[local_30].width[local_a0] * 2;
    local_a8 = local_20[local_a0] * local_a8;
  }
  local_b8 = local_b8 + alStack_78[local_b0] * local_a8;
  local_28 = GA[local_30].ptr[icode] + local_b8 * GA[local_30].elemsize;
  uVar4 = (ulong)GA[local_30].elemsize;
  IVar3 = pnga_type_c2f((long)GA[local_30].type);
  switch(IVar3) {
  case 0x3f2:
    *local_10 = (long)local_28 - (long)INT_MB >> 3;
    local_88 = (DoubleComplex *)INT_MB;
    break;
  case 0x3f4:
    *local_10 = (long)local_28 - (long)FLT_MB >> 2;
    local_88 = (DoubleComplex *)FLT_MB;
    break;
  case 0x3f5:
    *local_10 = (long)local_28 - (long)DBL_MB >> 3;
    local_88 = (DoubleComplex *)DBL_MB;
    break;
  case 0x3f6:
    *local_10 = (long)local_28 - (long)SCPL_MB >> 3;
    local_88 = (DoubleComplex *)SCPL_MB;
    break;
  case 0x3f7:
    *local_10 = (long)local_28 - (long)DCPL_MB >> 4;
    local_88 = DCPL_MB;
  }
  if ((ulong)local_28 % uVar4 != (ulong)local_88 % uVar4) {
    string = local_28;
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",GAme & 0xffffffff,local_28,(ulong)local_28 % uVar4,
           local_88,(ulong)local_88 % uVar4);
    pnga_error(string,icode);
  }
  *local_10 = *local_10 + 1;
  return;
}

Assistant:

void pnga_access_ghost_element(Integer g_a, AccessIndex* index,
                        Integer subscript[], Integer ld[])
{
char *ptr=NULL;
Integer  handle = GA_OFFSET + g_a;
Integer i=0;
Integer tmp_sub[MAXDIM];
unsigned long    elemsize=0;
unsigned long    lref=0, lptr=0;
Integer me = pnga_nodeid();
   /* Indices conform to Fortran convention. Shift them down 1 so that
      gam_LocationWithGhosts works. */
   for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1;
   gam_LocationWithGhosts(me, handle, tmp_sub, &ptr, ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;

   FLUSH_CACHE;
}